

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli.c
# Opt level: O2

int ParseInt(char *s,int low,int high,int *result)

{
  char cVar1;
  uint uVar2;
  long lVar3;
  int iVar5;
  undefined4 in_register_00000014;
  long lVar4;
  
  lVar3 = 0;
  lVar4 = 5;
  iVar5 = 0;
  do {
    if (lVar3 == 5) {
LAB_001035d3:
      uVar2 = (uint)lVar4;
      if (*s == '0') {
LAB_001035d8:
        lVar3 = 0;
      }
      else {
LAB_001035dd:
        lVar3 = 0;
        if ((s[uVar2] == '\0') && (iVar5 <= low && -1 < iVar5)) {
          *(int *)CONCAT44(in_register_00000014,high) = iVar5;
          return 1;
        }
      }
LAB_001035da:
      return (int)lVar3;
    }
    cVar1 = s[lVar3];
    if (cVar1 == '\0') {
      if ((int)lVar3 == 1) {
        uVar2 = 1;
        goto LAB_001035dd;
      }
      lVar4 = lVar3;
      if ((int)lVar3 == 0) goto LAB_001035da;
      goto LAB_001035d3;
    }
    if ((byte)(cVar1 - 0x3aU) < 0xf6) goto LAB_001035d8;
    iVar5 = (uint)(byte)(cVar1 - 0x30) + iVar5 * 10;
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

static BROTLI_BOOL ParseInt(const char* s, int low, int high, int* result) {
  int value = 0;
  int i;
  for (i = 0; i < 5; ++i) {
    char c = s[i];
    if (c == 0) break;
    if (s[i] < '0' || s[i] > '9') return BROTLI_FALSE;
    value = (10 * value) + (c - '0');
  }
  if (i == 0) return BROTLI_FALSE;
  if (i > 1 && s[0] == '0') return BROTLI_FALSE;
  if (s[i] != 0) return BROTLI_FALSE;
  if (value < low || value > high) return BROTLI_FALSE;
  *result = value;
  return BROTLI_TRUE;
}